

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV3MappingChannel(Parser *this,uint iChannel,Mesh *mesh)

{
  bool bVar1;
  uint local_2c;
  uint local_28;
  uint iNumTFaces;
  uint iNumTVertices;
  int iDepth;
  Mesh *mesh_local;
  Parser *pPStack_10;
  uint iChannel_local;
  Parser *this_local;
  
  iNumTFaces = 0;
  local_28 = 0;
  local_2c = 0;
  _iNumTVertices = mesh;
  mesh_local._4_4_ = iChannel;
  pPStack_10 = this;
  do {
    while (*this->filePtr != '*') {
LAB_00630f3d:
      if (*this->filePtr == '{') {
        iNumTFaces = iNumTFaces + 1;
      }
      else if (*this->filePtr == '}') {
        iNumTFaces = iNumTFaces - 1;
        if (iNumTFaces == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *MESH_MAPPING_CHANNEL chunk (Level 3)")
        ;
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVERTEX",0xf);
    if (bVar1) {
      ParseLV4MeshLong(this,&local_28);
    }
    else {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVFACES",0xf);
      if (bVar1) {
        ParseLV4MeshLong(this,&local_2c);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_TVERTLIST",0xe);
        if (bVar1) {
          ParseLV3MeshTListBlock(this,local_28,_iNumTVertices,mesh_local._4_4_);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_TFACELIST",0xe);
          if (!bVar1) goto LAB_00630f3d;
          ParseLV3MeshTFaceListBlock(this,local_2c,_iNumTVertices,mesh_local._4_4_);
        }
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MappingChannel(unsigned int iChannel, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh,iChannel);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh, iChannel);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_MAPPING_CHANNEL");
    }
    return;
}